

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

GaoVectorSet * __thiscall
AlphaVectorPlanning::BackProjectFull(AlphaVectorPlanning *this,VectorSet *v)

{
  size_t sVar1;
  size_type sVar2;
  PlanningUnitDecPOMDPDiscrete *this_00;
  PlanningUnitMADPDiscreteParameters *this_01;
  undefined8 uVar3;
  reference pvVar4;
  const_reference this_02;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDX;
  long in_RSI;
  GaoVectorSet *in_RDI;
  uint s_1;
  matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mO_1;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mO;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mT;
  uint s;
  matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mV;
  uint k;
  uint o;
  uint a;
  int dup;
  vector<int,_std::allocator<int>_> duplicates;
  double x;
  VectorSet vv;
  VectorSet v1;
  bool isEventDriven;
  uint nrInV;
  uint nrS;
  uint nrO;
  uint nrA;
  GaoVectorSet *G;
  AlphaVectorPlanning *in_stack_fffffffffffffd88;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd90;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_03;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd98;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffda0;
  matrix_type *in_stack_fffffffffffffda8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffdb0;
  reference in_stack_fffffffffffffdb8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdc0;
  reference in_stack_fffffffffffffdc8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdd0;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdd8;
  vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
  *e1;
  GaoVectorSet *V;
  undefined1 local_1e9 [69];
  int local_1a4;
  int local_12c;
  uint local_118;
  uint local_114;
  uint local_110;
  value_type local_10c;
  vector<int,_std::allocator<int>_> local_108;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_f0;
  pair<long,_long> local_98;
  vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
  local_88 [38];
  byte local_62;
  allocator<char> local_61;
  string local_60 [55];
  byte local_29;
  uint local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_18;
  
  V = in_RDI;
  local_18 = in_RDX;
  GetPU(in_stack_fffffffffffffd88);
  sVar1 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x908449);
  local_1c = (uint)sVar1;
  GetPU(in_stack_fffffffffffffd88);
  sVar1 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x908465);
  local_20 = (uint)sVar1;
  GetPU(in_stack_fffffffffffffd88);
  sVar1 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffd90);
  local_24 = (int)sVar1;
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(local_18);
  local_28 = (uint)sVar2;
  this_00 = GetPU(in_stack_fffffffffffffd88);
  this_01 = PlanningUnitMADPDiscrete::GetParams(&this_00->super_PlanningUnitMADPDiscrete);
  local_29 = PlanningUnitMADPDiscreteParameters::GetEventObservability(this_01);
  if (local_28 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
               (allocator<char> *)in_stack_fffffffffffffdc0);
    TimedAlgorithm::StartTimer
              ((TimedAlgorithm *)in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    local_62 = 0;
    local_98 = (pair<long,_long>)
               boost::detail::multi_array::extent_gen<0UL>::operator[]
                         ((extent_gen<0UL> *)in_stack_fffffffffffffdb0,
                          (index)in_stack_fffffffffffffda8);
    e1 = local_88;
    boost::detail::multi_array::extent_gen<1UL>::operator[]
              ((extent_gen<1UL> *)in_stack_fffffffffffffdb0,(index)in_stack_fffffffffffffda8);
    boost::
    multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::multi_array(in_stack_fffffffffffffdb0,(extent_gen<2UL> *)in_stack_fffffffffffffda8);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (size_type)in_stack_fffffffffffffdb0);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    GetDuplicateIndices((VectorSet *)V);
    for (local_110 = 0; local_110 != local_1c; local_110 = local_110 + 1) {
      for (local_114 = 0; local_114 != local_20; local_114 = local_114 + 1) {
        for (local_118 = 0; local_118 != local_28; local_118 = local_118 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(ulong)local_118);
          if (*pvVar4 == -1) {
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ::matrix_row((matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                         (size_type)in_stack_fffffffffffffda0);
            for (local_12c = 0; local_12c != local_24; local_12c = local_12c + 1) {
              std::
              vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              ::operator[]((vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                            *)(in_RSI + 0x28),(ulong)local_110);
              boost::numeric::ublas::
              matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              ::matrix_row((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                            *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                           (size_type)in_stack_fffffffffffffda0);
              if ((local_29 & 1) == 0) {
                std::
                vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                ::operator[]((vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                              *)(in_RSI + 0x40),(ulong)local_110);
                boost::numeric::ublas::
                matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::matrix_column((matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                                 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                (size_type)in_stack_fffffffffffffda0);
                boost::numeric::ublas::
                element_prod<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_column<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                          ((vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_fffffffffffffda8,
                           (vector_expression<boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_fffffffffffffda0);
                in_stack_fffffffffffffdd0 =
                     (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)boost::numeric::ublas::
                        inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_column<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                                  ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                                    *)e1,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                                          *)in_stack_fffffffffffffdd8);
                local_f0 = in_stack_fffffffffffffdd0;
                boost::numeric::ublas::
                vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                ::~vector_binary((vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                                  *)in_stack_fffffffffffffd90);
                boost::numeric::ublas::
                matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::~matrix_column((matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                                  *)in_stack_fffffffffffffd90);
              }
              else {
                this_02 = std::
                          vector<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                          ::operator[]((vector<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                                        *)(in_RSI + 0x88),(ulong)local_110);
                std::
                vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                ::operator[](this_02,(ulong)local_114);
                boost::numeric::ublas::
                matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::matrix_row((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                              *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                             (size_type)in_stack_fffffffffffffda0);
                boost::numeric::ublas::
                element_prod<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>>
                          ((vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_fffffffffffffda8,
                           (vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_fffffffffffffda0);
                in_stack_fffffffffffffdd8 =
                     (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)boost::numeric::ublas::
                        inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                                  (e1,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                                       *)in_stack_fffffffffffffdd8);
                local_f0 = in_stack_fffffffffffffdd8;
                boost::numeric::ublas::
                vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                ::~vector_binary((vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                                  *)in_stack_fffffffffffffd90);
                boost::numeric::ublas::
                matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::~matrix_row((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                               *)in_stack_fffffffffffffd90);
              }
              in_stack_fffffffffffffdc0 = local_f0;
              in_stack_fffffffffffffdc8 =
                   boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88,
                                0x908a1f);
              *in_stack_fffffffffffffdc8 = (double)in_stack_fffffffffffffdc0;
              boost::numeric::ublas::
              matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              ::~matrix_row((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                             *)in_stack_fffffffffffffd90);
            }
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ::~matrix_row((matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                           *)in_stack_fffffffffffffd90);
          }
          else {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(ulong)local_118)
            ;
            local_10c = *pvVar4;
            for (local_1a4 = 0; local_1a4 != local_24; local_1a4 = local_1a4 + 1) {
              in_stack_fffffffffffffdb8 =
                   boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88,
                                0x908ae3);
              in_stack_fffffffffffffda8 = (matrix_type *)*in_stack_fffffffffffffdb8;
              in_stack_fffffffffffffdb0 =
                   (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                    *)boost::numeric::ublas::
                      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88
                                   ,0x908b18);
              (in_stack_fffffffffffffdb0->
              super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
              ).
              super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
              .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        **)in_stack_fffffffffffffda8;
            }
          }
        }
        in_stack_fffffffffffffda0 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)operator_new(0x28);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::matrix(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        boost::
        multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
        ::operator[]((multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      *)in_stack_fffffffffffffdd8,(index)in_stack_fffffffffffffdd0);
        in_stack_fffffffffffffd98 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)boost::detail::multi_array::
                sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                ::operator[]((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                              *)in_stack_fffffffffffffdc0,(index)in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffd98->size1_ = (size_type)in_stack_fffffffffffffda0;
        boost::detail::multi_array::
        sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
        ::~sub_array((sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL>
                      *)0x908bd7);
      }
    }
    this_03 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
               *)local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
               (allocator<char> *)in_stack_fffffffffffffdc0);
    TimedAlgorithm::StopTimer((TimedAlgorithm *)this_03,(string *)in_stack_fffffffffffffd88);
    std::__cxx11::string::~string((string *)(local_1e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e9);
    local_62 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)this_03);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)this_03);
    if ((local_62 & 1) == 0) {
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::~multi_array(this_03);
    }
    return in_RDI;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  E::E((E *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

GaoVectorSet AlphaVectorPlanning::BackProjectFull(const VectorSet &v) const
{
    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates(),
        nrInV=v.size1();
    bool isEventDriven = GetPU()->GetParams().GetEventObservability();
    if(nrInV==0)
        throw(E("AlphaVectorPlanning::BackProjectFull attempting to backproject empty value function"));

#if DEBUG_AlphaVectorPlanning_BackProject
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BackProjectFull");
    
    GaoVectorSet G(boost::extents[nrA][nrO]);
    VectorSet v1(nrInV,nrS);
#if AlphaVectorPlanning_UseUBLASinBackProject
    VectorSet vv=v;
#endif
    double x;

#if AlphaVectorPlanning_CheckForDuplicates
    vector<int> duplicates=GetDuplicateIndices(v);
#else
    vector<int> duplicates(nrInV,-1);
#endif
    int dup;

    using namespace boost::numeric::ublas;

    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            for(unsigned int k=0;k!=nrInV;k++)
            {
                if(duplicates[k]==-1)
                {
#if AlphaVectorPlanning_UseUBLASinBackProject
                    const matrix_row<VectorSet> mV(vv,k);
#endif
                    for(unsigned int s=0;s!=nrS;s++)
                    {
#if AlphaVectorPlanning_UseUBLASinBackProject
                        matrix_row<const TransitionModelMapping::Matrix>
                            mT(*_m_T[a],s);
                        if(isEventDriven)
                        {
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            /// The distinction between row and column stems from the fact that
                            /// in a standard model, _m_O[a] is (s',o), while in an event-driven
                            /// model, _m_Oe[a][o] is (s,s') (because _m_T[a] is also (s,s'))
                            matrix_row<const ObservationModelMapping::Matrix> mO(*_m_Oe[a][o],s);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }else{
                            matrix_column<const ObservationModelMapping::Matrix> mO(*_m_O[a],o);
                            x=inner_prod(element_prod(mT,mO),mV);
                        }
#if AlphaVectorPlanning_VerifyUBLASinBackProject
                        double x1=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x1+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
                        if(abs(x-x1)>1e-14)
                        {
                            cerr << x << " " << x1 << " " << x-x1 << endl;
                            abort();
                        }
#endif
#else // AlphaVectorPlanning_UseUBLASinBackProject
                        x=0;
                        for(unsigned int s1=0;s1!=nrS;s1++)
                            x+=(*_m_O[a])(s1,o)*(*_m_T[a])(s,s1)*v(k,s1);
#endif
                        v1(k,s)=x;
                    }
                }
                else
                {
                    dup=duplicates[k];
                    for(unsigned int s=0;s!=nrS;s++)
                        v1(k,s)=v1(dup,s);
                }
            }
            G[a][o]=new VectorSet(v1);
        }

    StopTimer("BackProjectFull");

#if DEBUG_AlphaVectorPlanning_BackProjectFullPrintout
    cout << "BackProjectFull of:" << endl;
    for(unsigned int k=0;k!=nrInV;k++)
    {
        for(unsigned int s=0;s!=nrS;s++)
            cout << v(k,s) << " ";
        cout << endl;
    }

    VectorSet *VS;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            cout << "Gao a " << a << " o " << o << endl;

            VS=G[a][o];
            for(unsigned int k=0;k!=VS->size1();k++)
            {
                for(unsigned int s=0;s!=VS->size2();s++)
                    cout << (*VS)(k,s) << " ";
                cout << endl;
            }
        }
#endif

#if DEBUG_AlphaVectorPlanning_BackProjectFullSanityCheck
    double maxInV=-DBL_MAX;
    for(unsigned int k=0;k!=nrInV;k++)
        for(unsigned int s=0;s!=nrS;s++)
            maxInV=max(maxInV,v(k,s));

    double maxInGao=-DBL_MAX;
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int k=0;k!=nrInV;k++)
                for(unsigned int s=0;s!=nrS;s++)
                    maxInGao=max(maxInGao,(*G[a][o])(k,s));

    if(maxInGao>maxInV)
    {
        cout << "Max value in V is " << maxInV << ", max in Gao is "
             << maxInGao << endl;
        abort();
    }
#endif

#if DEBUG_AlphaVectorPlanning_BackProject
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorPlanning::BackProject done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
    // test results on 22-12-2006
    // using dense Matrix is about 2 faster than calling the Get*Prob()
    // using sparse Matrix is almost 3 times slower then dense Matrix
#endif
    return(G);
}